

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O2

void __thiscall wabt::Token::Token(Token *this,Location loc,TokenType token_type,Literal *literal)

{
  (this->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
  *(undefined8 *)((long)&(this->loc).field_1 + 8) = loc.field_1._8_8_;
  (this->loc).filename.data_ = loc.filename.data_;
  (this->loc).filename.size_ = loc.filename.size_;
  this->token_type_ = token_type;
  if (token_type - First_Literal < 3) {
    Literal::Literal(&(this->field_2).literal_,literal);
    return;
  }
  __assert_fail("HasLiteral()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/token.cc"
                ,0x45,"wabt::Token::Token(Location, TokenType, const Literal &)");
}

Assistant:

Token::Token(Location loc, TokenType token_type, const Literal& literal)
    : loc(loc), token_type_(token_type) {
  assert(HasLiteral());
  Construct(literal_, literal);
}